

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemToolsAppendComponents
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *out_components,iterator first,iterator last)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  pointer pbVar5;
  const_iterator i;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  if ((SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
       ::up_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                                   ::up_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                ::up_abi_cxx11_,"..",&local_29);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                  ::up_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                         ::up_abi_cxx11_);
  }
  if ((SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
       ::cur_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                                   ::cur_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                ::cur_abi_cxx11_,".",&local_2a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                  ::cur_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                         ::cur_abi_cxx11_);
  }
  do {
    if (first._M_current == last._M_current) {
      return;
    }
    _Var1 = std::operator==(first._M_current,
                            &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                             ::up_abi_cxx11_);
    if (_Var1) {
      pbVar4 = (out_components->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (out_components->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (0x20 < (ulong)((long)pbVar5 - (long)pbVar4)) {
        bVar2 = std::operator!=(pbVar5 + -1,
                                &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                                 ::up_abi_cxx11_);
        pbVar4 = (out_components->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (out_components->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(out_components,((long)pbVar5 - (long)pbVar4 >> 5) - 1);
          goto LAB_0053ec8d;
        }
      }
      if ((pbVar4 != pbVar5) && (pbVar4->_M_string_length == 0)) {
LAB_0053ec82:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   out_components,first._M_current);
      }
    }
    else if (((first._M_current)->_M_string_length != 0) &&
            (bVar2 = std::operator!=(first._M_current,
                                     &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                                      ::cur_abi_cxx11_), bVar2)) goto LAB_0053ec82;
LAB_0053ec8d:
    first._M_current = first._M_current + 1;
  } while( true );
}

Assistant:

static void SystemToolsAppendComponents(
  std::vector<std::string>& out_components,
  std::vector<std::string>::iterator first,
  std::vector<std::string>::iterator last)
{
  static const std::string up = "..";
  static const std::string cur = ".";
  for (std::vector<std::string>::const_iterator i = first; i != last; ++i) {
    if (*i == up) {
      // Remove the previous component if possible.  Ignore ../ components
      // that try to go above the root.  Keep ../ components if they are
      // at the beginning of a relative path (base path is relative).
      if (out_components.size() > 1 && out_components.back() != up) {
        out_components.resize(out_components.size() - 1);
      } else if (!out_components.empty() && out_components[0].empty()) {
        out_components.emplace_back(std::move(*i));
      }
    } else if (!i->empty() && *i != cur) {
      out_components.emplace_back(std::move(*i));
    }
  }
}